

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask8_16(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  vpmovsxbd_avx(ZEXT416(0x30201000));
  vpmovsxbd_avx(ZEXT416(0x3c2c1c0c));
  puVar1 = in + 4;
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)puVar1));
  vpmovsxbd_avx(ZEXT416(0x34241404));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)this);
  auVar4 = vpslld_avx(auVar3,0x18);
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)puVar1));
  auVar3 = vpslld_avx(auVar3,8);
  auVar2 = vpor_avx(auVar3,auVar2);
  vpmovsxbd_avx(ZEXT416(0x38281808));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar3 = vpslld_avx(auVar3,0x10);
  auVar2 = vpternlogd_avx512vl(auVar4,auVar3,auVar2,0xfe);
  *(undefined1 (*) [16])in = auVar2;
  return puVar1;
}

Assistant:

uint32_t *__fastpackwithoutmask8_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;

  return out;
}